

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stk.cpp
# Opt level: O1

void stk::Stk::swap64(uchar *ptr)

{
  ushort *puVar1;
  uchar uVar2;
  ushort uVar3;
  
  uVar2 = *ptr;
  *ptr = ptr[7];
  ptr[7] = uVar2;
  uVar3 = *(ushort *)(ptr + 1);
  *(ushort *)(ptr + 1) = *(ushort *)(ptr + 5) << 8 | *(ushort *)(ptr + 5) >> 8;
  *(ushort *)(ptr + 5) = uVar3 << 8 | uVar3 >> 8;
  puVar1 = (ushort *)(ptr + 3);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  return;
}

Assistant:

void Stk :: swap64(unsigned char *ptr)
{
  unsigned char val;

  // Swap 1st and 8th bytes
  val = *(ptr);
  *(ptr) = *(ptr+7);
  *(ptr+7) = val;

  // Swap 2nd and 7th bytes
  ptr += 1;
  val = *(ptr);
  *(ptr) = *(ptr+5);
  *(ptr+5) = val;

  // Swap 3rd and 6th bytes
  ptr += 1;
  val = *(ptr);
  *(ptr) = *(ptr+3);
  *(ptr+3) = val;

  // Swap 4th and 5th bytes
  ptr += 1;
  val = *(ptr);
  *(ptr) = *(ptr+1);
  *(ptr+1) = val;
}